

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

int luaK_codek(FuncState *fs,int reg,int k)

{
  int iVar1;
  
  if (k < 0x40000) {
    iVar1 = luaK_code(fs,reg << 6 | k << 0xe | 1);
    return iVar1;
  }
  iVar1 = luaK_code(fs,reg << 6 | 2);
  luaK_code(fs,k << 6 | 0x2e);
  return iVar1;
}

Assistant:

int luaK_codek (FuncState *fs, int reg, int k) {
  if (k <= MAXARG_Bx)
    return luaK_codeABx(fs, OP_LOADK, reg, k);
  else {
    int p = luaK_codeABx(fs, OP_LOADKX, reg, 0);
    codeextraarg(fs, k);
    return p;
  }
}